

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O3

void highbd_resize_multistep
               (uint16_t *input,int length,uint16_t *output,int olength,uint16_t *otmp,int bd)

{
  int iVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  bool bVar10;
  uint16_t uVar11;
  int iVar12;
  uint uVar13;
  uint16_t *puVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  int iVar19;
  uint uVar20;
  uint16_t *puVar21;
  int sum_2;
  uint16_t *puVar22;
  undefined2 uVar23;
  uint uVar24;
  ulong uVar25;
  ushort *puVar26;
  ulong uVar27;
  int sum;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint16_t *puVar31;
  int iVar32;
  ushort *puVar33;
  long lVar34;
  int iVar35;
  undefined1 auVar36 [16];
  
  if (length == olength) {
    memcpy(output,input,(long)length * 2);
    return;
  }
  uVar24 = 0;
  iVar12 = length;
  do {
    iVar12 = iVar12 + 1 >> 1;
    if (iVar12 < olength) {
      if (uVar24 == 0) goto LAB_003accf5;
      break;
    }
    uVar24 = uVar24 + 1;
  } while (iVar12 != 1);
  iVar12 = length + 1;
  puVar14 = (uint16_t *)0x0;
  uVar30 = 0;
  uVar27 = (ulong)(uint)length;
  do {
    iVar1 = (int)uVar27;
    length = iVar1 + 1 >> 1;
    puVar22 = puVar14;
    if (uVar30 == 0) {
      puVar22 = input;
    }
    puVar14 = otmp + (int)(-(uVar30 & 1) & iVar12 >> 1);
    if (length == olength && uVar30 == uVar24 - 1) {
      puVar14 = output;
    }
    if ((uVar27 & 1) == 0) {
      if (iVar1 < 8) {
        if (0 < iVar1) {
          iVar19 = 1;
          uVar25 = 0;
          puVar31 = puVar14;
          do {
            iVar28 = 0x40;
            uVar16 = uVar25 & 0xffffffff;
            lVar34 = 0;
            iVar32 = iVar19;
            do {
              uVar15 = 0;
              if (0 < (int)uVar16) {
                uVar15 = uVar16;
              }
              iVar35 = iVar1 + -1;
              if (iVar32 < iVar1 + -1) {
                iVar35 = iVar32;
              }
              iVar28 = iVar28 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar34) *
                                ((uint)puVar22[iVar35] + (uint)puVar22[uVar15]);
              lVar34 = lVar34 + 2;
              iVar32 = iVar32 + 1;
              uVar16 = (ulong)((int)uVar16 - 1);
            } while (lVar34 != 8);
            uVar29 = iVar28 >> 7;
            if (bd == 10) {
              uVar20 = 0x3ff;
            }
            else if (bd == 0xc) {
              uVar20 = 0xfff;
            }
            else {
              uVar20 = 0xff;
            }
            if (uVar29 < uVar20) {
              uVar20 = uVar29;
            }
            uVar11 = (uint16_t)uVar20;
            if ((int)uVar29 < 0) {
              uVar11 = 0;
            }
            *puVar31 = uVar11;
            puVar31 = puVar31 + 1;
            uVar25 = uVar25 + 2;
            iVar19 = iVar19 + 2;
          } while (uVar25 < uVar27);
        }
      }
      else {
        uVar27 = 0;
        puVar31 = puVar14;
        bVar10 = true;
        do {
          bVar18 = bVar10;
          puVar21 = puVar31;
          lVar34 = uVar27 * 2;
          iVar19 = 0x40;
          lVar17 = 0;
          do {
            uVar25 = 0;
            if (0 < (int)uVar27) {
              uVar25 = uVar27;
            }
            iVar19 = iVar19 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar17) *
                              ((uint)*(ushort *)((long)puVar22 + lVar17 + lVar34 + 2) +
                              (uint)puVar22[uVar25]);
            lVar17 = lVar17 + 2;
            uVar27 = (ulong)((int)uVar27 - 1);
          } while (lVar17 != 8);
          uVar29 = iVar19 >> 7;
          if (bd == 10) {
            uVar20 = 0x3ff;
          }
          else if (bd == 0xc) {
            uVar20 = 0xfff;
          }
          else {
            uVar20 = 0xff;
          }
          if (uVar29 < uVar20) {
            uVar20 = uVar29;
          }
          uVar11 = (uint16_t)uVar20;
          if ((int)uVar29 < 0) {
            uVar11 = 0;
          }
          *puVar21 = uVar11;
          puVar31 = puVar21 + 1;
          uVar27 = 2;
          bVar10 = false;
        } while (bVar18);
        uVar27 = 4;
        if (iVar1 - 4U != 4) {
          uVar27 = 4;
          do {
            uVar25 = uVar27;
            uVar27 = *(ulong *)(puVar22 + uVar25 + 1);
            auVar2._8_4_ = 0;
            auVar2._0_8_ = uVar27;
            auVar2._12_2_ = (short)(uVar27 >> 0x30);
            auVar4._8_2_ = (short)(uVar27 >> 0x20);
            auVar4._0_8_ = uVar27;
            auVar4._10_4_ = auVar2._10_4_;
            auVar8._6_8_ = 0;
            auVar8._0_6_ = auVar4._8_6_;
            auVar6._4_2_ = (short)(uVar27 >> 0x10);
            auVar6._0_4_ = (uint)uVar27;
            auVar6._6_8_ = SUB148(auVar8 << 0x40,6);
            auVar36._8_8_ = 0;
            auVar36._0_8_ = *(ulong *)(puVar22 + (uVar25 - 3));
            auVar36 = pshuflw(auVar36,auVar36,0x1b);
            auVar3._10_2_ = 0;
            auVar3._0_10_ = auVar36._0_10_;
            auVar3._12_2_ = auVar36._6_2_;
            auVar5._8_2_ = auVar36._4_2_;
            auVar5._0_8_ = auVar36._0_8_;
            auVar5._10_4_ = auVar3._10_4_;
            auVar9._6_8_ = 0;
            auVar9._0_6_ = auVar5._8_6_;
            auVar7._4_2_ = auVar36._2_2_;
            auVar7._0_4_ = auVar36._0_4_;
            auVar7._6_8_ = SUB148(auVar9 << 0x40,6);
            uVar20 = (int)(((auVar7._4_4_ + auVar6._4_4_) * 0xc -
                           ((auVar3._10_4_ >> 0x10) + (auVar2._10_4_ >> 0x10))) +
                          (auVar5._8_4_ + auVar4._8_4_) * -3 +
                          ((auVar36._0_4_ & 0xffff) + ((uint)uVar27 & 0xffff)) * 0x38 + 0x40) >> 7;
            uVar29 = uVar20;
            if (bd == 10) {
              if (0x3fe < uVar20) {
                uVar29 = 0x3ff;
              }
            }
            else if (bd == 0xc) {
              if (0xffe < uVar20) {
                uVar29 = 0xfff;
              }
            }
            else if (0xfe < uVar20) {
              uVar29 = 0xff;
            }
            uVar23 = 0;
            if (-1 < (int)uVar20) {
              uVar23 = (undefined2)uVar29;
            }
            *(undefined2 *)((long)puVar21 + (uVar25 - 2)) = uVar23;
            uVar27 = uVar25 + 2;
          } while (uVar27 < iVar1 - 4U);
          puVar31 = (uint16_t *)((long)puVar31 + (uVar25 - 2));
        }
        if ((int)uVar27 < iVar1) {
          uVar25 = uVar27 & 0xffffffff;
          iVar19 = (int)uVar27 + 1;
          puVar26 = puVar22 + uVar25;
          do {
            iVar28 = 0x40;
            lVar34 = 0;
            puVar33 = puVar26;
            iVar32 = iVar19;
            do {
              iVar35 = iVar1 + -1;
              if (iVar32 < iVar1 + -1) {
                iVar35 = iVar32;
              }
              iVar28 = iVar28 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar34) *
                                ((uint)puVar22[iVar35] + (uint)*puVar33);
              lVar34 = lVar34 + 2;
              iVar32 = iVar32 + 1;
              puVar33 = puVar33 + -1;
            } while (lVar34 != 8);
            uVar29 = iVar28 >> 7;
            if (bd == 10) {
              uVar20 = 0x3ff;
            }
            else if (bd == 0xc) {
              uVar20 = 0xfff;
            }
            else {
              uVar20 = 0xff;
            }
            if (uVar29 < uVar20) {
              uVar20 = uVar29;
            }
            uVar11 = (uint16_t)uVar20;
            if ((int)uVar29 < 0) {
              uVar11 = 0;
            }
            *puVar31 = uVar11;
            puVar31 = puVar31 + 1;
            uVar25 = uVar25 + 2;
            iVar19 = iVar19 + 2;
            puVar26 = puVar26 + 2;
          } while ((int)uVar25 < iVar1);
        }
      }
    }
    else if (iVar1 < 7) {
      if (0 < iVar1) {
        iVar19 = 1;
        uVar29 = 0xffffffff;
        uVar25 = 0;
        puVar31 = puVar14;
        do {
          iVar32 = (uint)puVar22[uVar25] * 0x40 + 0x40;
          lVar34 = 0;
          uVar20 = uVar29;
          do {
            uVar16 = 0;
            if (0 < (int)uVar20) {
              uVar16 = (ulong)uVar20;
            }
            iVar28 = iVar19 + (int)lVar34;
            if (iVar1 + -1 <= iVar28) {
              iVar28 = iVar1 + -1;
            }
            iVar32 = iVar32 + (int)av1_down2_symodd_half_filter[lVar34 + 1] *
                              ((uint)puVar22[iVar28] + (uint)puVar22[uVar16]);
            lVar34 = lVar34 + 1;
            uVar20 = uVar20 - 1;
          } while (lVar34 != 3);
          uVar20 = iVar32 >> 7;
          if (bd == 10) {
            uVar13 = 0x3ff;
          }
          else if (bd == 0xc) {
            uVar13 = 0xfff;
          }
          else {
            uVar13 = 0xff;
          }
          if (uVar20 < uVar13) {
            uVar13 = uVar20;
          }
          uVar11 = (uint16_t)uVar13;
          if ((int)uVar20 < 0) {
            uVar11 = 0;
          }
          *puVar31 = uVar11;
          puVar31 = puVar31 + 1;
          uVar25 = uVar25 + 2;
          iVar19 = iVar19 + 2;
          uVar29 = uVar29 + 2;
        } while (uVar25 < uVar27);
      }
    }
    else {
      lVar34 = 0;
      puVar31 = puVar14;
      bVar10 = true;
      do {
        bVar18 = bVar10;
        iVar19 = (uint)puVar22[lVar34] * 0x40 + 0x40;
        uVar29 = (uint)lVar34;
        lVar17 = 1;
        do {
          uVar29 = uVar29 - 1;
          uVar27 = 0;
          if (0 < (int)uVar29) {
            uVar27 = (ulong)uVar29;
          }
          iVar19 = iVar19 + (int)av1_down2_symodd_half_filter[lVar17] *
                            ((uint)(puVar22 + lVar34)[lVar17] + (uint)puVar22[uVar27]);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 4);
        uVar29 = iVar19 >> 7;
        if (bd == 10) {
          uVar20 = 0x3ff;
        }
        else if (bd == 0xc) {
          uVar20 = 0xfff;
        }
        else {
          uVar20 = 0xff;
        }
        if (uVar29 < uVar20) {
          uVar20 = uVar29;
        }
        uVar11 = (uint16_t)uVar20;
        if ((int)uVar29 < 0) {
          uVar11 = 0;
        }
        *puVar31 = uVar11;
        puVar31 = puVar31 + 1;
        lVar34 = 2;
        bVar10 = false;
      } while (bVar18);
      uVar27 = 4;
      if (iVar1 - 3U != 4) {
        uVar27 = 4;
        puVar21 = puVar22;
        do {
          iVar19 = (uint)puVar22[uVar27] * 0x40 + 0x40;
          lVar34 = 3;
          lVar17 = 5;
          do {
            iVar19 = iVar19 + (int)av1_down2_symeven_half_filter[lVar17] *
                              ((uint)puVar21[lVar17] + (uint)puVar21[lVar34]);
            lVar17 = lVar17 + 1;
            lVar34 = lVar34 + -1;
          } while (lVar34 != 0);
          uVar29 = iVar19 >> 7;
          if (bd == 10) {
            uVar20 = 0x3ff;
          }
          else if (bd == 0xc) {
            uVar20 = 0xfff;
          }
          else {
            uVar20 = 0xff;
          }
          if (uVar29 < uVar20) {
            uVar20 = uVar29;
          }
          uVar11 = (uint16_t)uVar20;
          if ((int)uVar29 < 0) {
            uVar11 = 0;
          }
          *puVar31 = uVar11;
          puVar31 = puVar31 + 1;
          uVar27 = uVar27 + 2;
          puVar21 = puVar21 + 2;
        } while (uVar27 < iVar1 - 3U);
      }
      if ((int)uVar27 < iVar1) {
        uVar27 = uVar27 & 0xffffffff;
        puVar26 = puVar22 + (uVar27 - 1);
        do {
          iVar19 = (uint)puVar22[uVar27] * 0x40 + 0x40;
          lVar34 = 1;
          puVar33 = puVar26;
          do {
            iVar32 = (int)uVar27 + (int)lVar34;
            if (iVar1 + -1 <= iVar32) {
              iVar32 = iVar1 + -1;
            }
            iVar19 = iVar19 + (int)av1_down2_symodd_half_filter[lVar34] *
                              ((uint)puVar22[iVar32] + (uint)*puVar33);
            lVar34 = lVar34 + 1;
            puVar33 = puVar33 + -1;
          } while (lVar34 != 4);
          uVar29 = iVar19 >> 7;
          if (bd == 10) {
            uVar20 = 0x3ff;
          }
          else if (bd == 0xc) {
            uVar20 = 0xfff;
          }
          else {
            uVar20 = 0xff;
          }
          if (uVar29 < uVar20) {
            uVar20 = uVar29;
          }
          uVar11 = (uint16_t)uVar20;
          if ((int)uVar29 < 0) {
            uVar11 = 0;
          }
          *puVar31 = uVar11;
          puVar31 = puVar31 + 1;
          uVar27 = uVar27 + 2;
          puVar26 = puVar26 + 2;
        } while ((int)uVar27 < iVar1);
      }
    }
    uVar30 = uVar30 + 1;
    uVar27 = (ulong)(uint)length;
  } while (uVar30 != uVar24);
  input = puVar14;
  if (length == olength) {
    return;
  }
LAB_003accf5:
  highbd_interpolate(input,length,output,olength,bd);
  return;
}

Assistant:

static void highbd_resize_multistep(const uint16_t *const input, int length,
                                    uint16_t *output, int olength,
                                    uint16_t *otmp, int bd) {
  if (length == olength) {
    memcpy(output, input, sizeof(output[0]) * length);
    return;
  }
  const int steps = get_down2_steps(length, olength);

  if (steps > 0) {
    uint16_t *out = NULL;
    int filteredlength = length;

    assert(otmp != NULL);
    uint16_t *otmp2 = otmp + get_down2_length(length, 1);
    for (int s = 0; s < steps; ++s) {
      const int proj_filteredlength = get_down2_length(filteredlength, 1);
      const uint16_t *const in = (s == 0 ? input : out);
      if (s == steps - 1 && proj_filteredlength == olength)
        out = output;
      else
        out = (s & 1 ? otmp2 : otmp);
      if (filteredlength & 1)
        highbd_down2_symodd(in, filteredlength, out, bd);
      else
        highbd_down2_symeven(in, filteredlength, out, bd);
      filteredlength = proj_filteredlength;
    }
    if (filteredlength != olength) {
      highbd_interpolate(out, filteredlength, output, olength, bd);
    }
  } else {
    highbd_interpolate(input, length, output, olength, bd);
  }
}